

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

TransformSet * pbrt::Inverse(TransformSet *__return_storage_ptr__,TransformSet *ts)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  long lVar18;
  
  TransformSet::TransformSet(__return_storage_ptr__);
  for (lVar18 = 0; lVar18 != 0x100; lVar18 = lVar18 + 0x80) {
    puVar1 = (undefined8 *)((long)ts->t[0].mInv.m[0] + lVar18);
    uVar3 = *puVar1;
    uVar4 = puVar1[1];
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    uVar7 = puVar1[4];
    uVar8 = puVar1[5];
    uVar9 = puVar1[6];
    uVar10 = puVar1[7];
    puVar1 = (undefined8 *)((long)ts->t[0].m.m[0] + lVar18);
    uVar11 = puVar1[1];
    uVar12 = puVar1[2];
    uVar13 = puVar1[3];
    uVar14 = puVar1[4];
    uVar15 = puVar1[5];
    uVar16 = puVar1[6];
    uVar17 = puVar1[7];
    puVar2 = (undefined8 *)((long)__return_storage_ptr__->t[0].mInv.m[0] + lVar18);
    *puVar2 = *puVar1;
    puVar2[1] = uVar11;
    puVar2[2] = uVar12;
    puVar2[3] = uVar13;
    puVar2[4] = uVar14;
    puVar2[5] = uVar15;
    puVar2[6] = uVar16;
    puVar2[7] = uVar17;
    puVar1 = (undefined8 *)((long)__return_storage_ptr__->t[0].m.m[0] + lVar18);
    *puVar1 = uVar3;
    puVar1[1] = uVar4;
    puVar1[2] = uVar5;
    puVar1[3] = uVar6;
    puVar1[4] = uVar7;
    puVar1[5] = uVar8;
    puVar1[6] = uVar9;
    puVar1[7] = uVar10;
  }
  return __return_storage_ptr__;
}

Assistant:

TransformSet Inverse(const TransformSet &ts) {
        TransformSet tInv;
        for (int i = 0; i < MaxTransforms; ++i)
            tInv.t[i] = Inverse(ts.t[i]);
        return tInv;
    }